

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O0

int piece_left_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  Am_Object local_40 [3];
  Am_Object local_28;
  int local_1c;
  undefined1 local_15;
  int col;
  bool black_player;
  Am_Object *pAStack_10;
  int rank;
  Am_Object *self_local;
  
  pAStack_10 = self;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  col = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)pAStack_10,(ulong)BLACK_PLAYER);
  local_15 = Am_Value::operator_cast_to_bool(pAVar1);
  if ((bool)local_15) {
    Am_Object::Get_Object((ushort)&local_28,0x110320);
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_28,(ulong)COLUMN);
    local_1c = Am_Value::operator_cast_to_int(pAVar1);
    Am_Object::~Am_Object(&local_28);
  }
  else {
    Am_Object::Get_Object((ushort)local_40,0x110318);
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)local_40,(ulong)COLUMN);
    local_1c = Am_Value::operator_cast_to_int(pAVar1);
    Am_Object::~Am_Object(local_40);
  }
  return local_1c * 0x32;
}

Assistant:

Am_Define_Formula(int, piece_left)
{
  int rank = self.Get(Am_RANK);
  bool black_player = self.Get(BLACK_PLAYER);
  int col;

#if 0
  bool visible = self.Get (Am_VISIBLE);
  if (!visible)
    col = -1;  // disappear offscreen
  else
#endif
  if (black_player)
    col = Black_Pieces.Get_Object(piece_slot[rank]).Get(COLUMN);
  else
    col = Red_Pieces.Get_Object(piece_slot[rank]).Get(COLUMN);
  return col * 50;
}